

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O1

void set_log_dest(QPDFLogger *l,function<void_(std::shared_ptr<Pipeline>)> *method,
                 qpdf_log_dest_e dest,char *identifier,qpdf_log_fn_t fn,void *udata)

{
  undefined1 local_99;
  shared_ptr<Pipeline> local_98;
  Pl_Function *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  shared_ptr<Pipeline> local_78;
  shared_ptr<Pipeline> local_68;
  shared_ptr<Pipeline> local_58;
  shared_ptr<Pipeline> local_48;
  void *local_38;
  qpdf_log_fn_t local_30;
  char *local_28;
  void *local_20;
  
  local_38 = udata;
  local_30 = fn;
  local_28 = identifier;
  switch(dest) {
  case qpdf_log_dest_default:
    local_98.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_98.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((method->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*method->_M_invoker)((_Any_data *)method,&local_98);
    local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case qpdf_log_dest_stdout:
    QPDFLogger::standardOutput(l);
    if ((method->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*method->_M_invoker)((_Any_data *)method,&local_48);
    local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_48.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case qpdf_log_dest_stderr:
    QPDFLogger::standardError(l);
    if ((method->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*method->_M_invoker)((_Any_data *)method,&local_58);
    local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_58.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case qpdf_log_dest_discard:
    QPDFLogger::discard(l);
    if ((method->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*method->_M_invoker)((_Any_data *)method,&local_68);
    break;
  case qpdf_log_dest_custom:
    local_20 = (void *)0x0;
    local_88 = (Pl_Function *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_Function,std::allocator<Pl_Function>,char_const*&,decltype(nullptr),int(*&)(char_const*,unsigned_long,void*),void*&>
              (&_Stack_80,&local_88,(allocator<Pl_Function> *)&local_99,&local_28,&local_20,
               (_func_int_char_ptr_unsigned_long_void_ptr **)&local_30,&local_38);
    local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_Pipeline;
    local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_80._M_pi;
    local_88 = (Pl_Function *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((method->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*method->_M_invoker)((_Any_data *)method,&local_78);
    local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_80._M_pi;
    if (local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
      local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_80._M_pi;
    }
    break;
  default:
    goto switchD_0025ee0e_default;
  }
  if (local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
switchD_0025ee0e_default:
  return;
}

Assistant:

static void
set_log_dest(
    QPDFLogger* l,
    std::function<void(std::shared_ptr<Pipeline>)> method,
    qpdf_log_dest_e dest,
    char const* identifier,
    qpdf_log_fn_t fn,
    void* udata)
{
    switch (dest) {
    case qpdf_log_dest_default:
        method(nullptr);
        break;
    case qpdf_log_dest_stdout:
        method(l->standardOutput());
        break;
    case qpdf_log_dest_stderr:
        method(l->standardError());
        break;
    case qpdf_log_dest_discard:
        method(l->discard());
        break;
    case qpdf_log_dest_custom:
        method(std::make_shared<Pl_Function>(identifier, nullptr, fn, udata));
        break;
    }
}